

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cform.cxx
# Opt level: O3

void __thiscall xray_re::xr_cform::optimize(xr_cform *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
  _Var4;
  long lVar5;
  cf_face *face;
  ulong uVar6;
  pointer this_00;
  pointer pcVar7;
  
  _Var4 = std::
          __remove_if<__gnu_cxx::__normal_iterator<xray_re::cf_face*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>,__gnu_cxx::__ops::_Iter_pred<face_degenerate_pred>>
                    ((this->m_faces).
                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl
                     .super__Vector_impl_data._M_start,
                     (this->m_faces).
                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl
                     .super__Vector_impl_data._M_finish);
  if (_Var4._M_current !=
      (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var4._M_current;
  }
  generate_vertex_faces(this);
  this_00 = (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar7 = (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pcVar7) {
    do {
      if ((this_00->field_1).dummy != 0xffffffff) {
        uVar6 = (ulong)(this_00->field_0).field_0.v[0];
        uVar3 = (this->m_vertices).
                super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].face0;
        while (uVar3 != 0xffffffff) {
          face = (this->m_faces).
                 super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar3;
          if (this_00 < face) {
            bVar2 = cf_face::is_duplicate(this_00,face);
            if (bVar2) {
              (face->field_1).dummy = 0xffffffff;
              uVar6 = (ulong)(this_00->field_0).field_0.v[0];
            }
          }
          lVar1 = 3;
          do {
            lVar5 = lVar1;
            if (lVar5 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_cform.h"
                            ,0x65,
                            "uint_fast32_t xray_re::cf_face::next_face_idx(uint_fast32_t) const");
            }
            lVar1 = lVar5 + -1;
          } while (*(int *)((long)face + (lVar5 + -1) * 4) != (int)uVar6);
          uVar3 = *(uint *)((long)&face->field_0 + lVar5 * 4 + 8);
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != pcVar7);
    this_00 = (this->m_faces).
              super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar7 = (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  _Var4 = std::
          __remove_if<__gnu_cxx::__normal_iterator<xray_re::cf_face*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>,__gnu_cxx::__ops::_Iter_pred<face_duplicate_pred>>
                    (this_00,pcVar7);
  if (_Var4._M_current !=
      (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var4._M_current;
  }
  generate_vertex_faces(this);
  return;
}

Assistant:

void xr_cform::optimize()
{
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), face_degenerate_pred()), m_faces.end());

	generate_vertex_faces();
	for (cf_face_vec_it it = m_faces.begin(), end = m_faces.end(); it != end; ++it) {
		if (it->dummy == BAD_IDX)
			continue;
		for (uint_fast32_t next = m_vertices[it->v0].face0; next != BAD_IDX;) {
			cf_face& face = m_faces[next];
			if (&face > &*it && it->is_duplicate(face))
				face.dummy = BAD_IDX;
			next = face.next_face_idx(it->v0);
		}
	}
//	size_t n = count_if(m_faces.begin(), m_faces.end(), is_duplicate());
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), face_duplicate_pred()), m_faces.end());
//	msg("CFORM optimize: was %"PRIuSIZE", left: %"PRIuSIZE"\n", n, m_faces.size());

	generate_vertex_faces();
}